

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
__thiscall pstore::broker::parse(broker *this,message_type *msg,partial_cmds *cmds)

{
  byte *pbVar1;
  pointer *ppuVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr;
  long *plVar3;
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined1 uVar6;
  ulong uVar7;
  undefined1 uVar8;
  pointer puVar9;
  unsigned_long uVar10;
  int iVar11;
  undefined8 uVar12;
  long lVar13;
  string *psVar14;
  _Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
  __it;
  long *plVar15;
  ulong *puVar16;
  part_number_too_large *this_00;
  runtime_error *this_01;
  long lVar17;
  long *plVar18;
  long lVar19;
  _Head_base<0UL,_pstore::broker::broker_command_*,_false> _Var20;
  byte *pbVar21;
  long lVar22;
  payload_type *ppVar23;
  ulong uVar24;
  long *plVar25;
  byte *pbVar26;
  byte *pbVar27;
  pair<std::__detail::_Node_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_false,_true>,_bool>
  pVar28;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  payload;
  string complete_command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  _Hashtable<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_std::hash<std::pair<unsigned_long,_unsigned_long>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_e8;
  __uniq_ptr_impl<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
  local_e0;
  pointer *local_d8;
  ulong local_d0;
  undefined1 local_c8;
  uint7 uStack_c7;
  pointer puStack_c0;
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_b8;
  ulong local_b0;
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_a8;
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  vStack_90;
  key_type local_78;
  vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_68;
  byte *local_50;
  long local_48;
  byte local_40;
  undefined7 uStack_3f;
  
  local_e8 = &cmds->_M_h;
  local_e0._M_t.
  super__Tuple_impl<0UL,_pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
  .super__Head_base<0UL,_pstore::broker::broker_command_*,_false>._M_head_impl =
       (tuple<pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
        )(tuple<pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
          )this;
  if (msg->num_parts <= msg->part_no) {
    this_00 = (part_number_too_large *)__cxa_allocate_exception(0x10);
    part_number_too_large::part_number_too_large(this_00);
    __cxa_throw(this_00,&part_number_too_large::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar12 = std::chrono::_V2::system_clock::now();
  lVar13 = 0x100;
  lVar17 = 0xfd;
  lVar19 = 0xfe;
  lVar22 = 0xff;
  uVar24 = 0x3e;
  do {
    if ((msg->payload)._M_elems[lVar22 + -0xc] != '\0') {
      ppVar23 = (payload_type *)((msg->payload)._M_elems + lVar13 + -0xc);
      break;
    }
    if ((msg->payload)._M_elems[lVar22 + -0xd] != '\0') {
      ppVar23 = (payload_type *)((msg->payload)._M_elems + lVar22 + -0xc);
      break;
    }
    if ((msg->payload)._M_elems[lVar22 + -0xe] != '\0') {
      ppVar23 = (payload_type *)((msg->payload)._M_elems + lVar19 + -0xc);
      break;
    }
    if ((msg->payload)._M_elems[lVar22 + -0xf] != '\0') {
      ppVar23 = (payload_type *)((msg->payload)._M_elems + lVar17 + -0xc);
      break;
    }
    lVar13 = lVar13 + -4;
    lVar17 = lVar17 + -4;
    lVar19 = lVar19 + -4;
    lVar22 = lVar22 + -4;
    uVar24 = uVar24 - 1;
    ppVar23 = &msg->payload;
  } while (1 < uVar24);
  psVar14 = (string *)operator_new(0x20);
  *(string **)psVar14 = psVar14 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar14,&msg->payload,ppVar23);
  local_78.first = (unsigned_long)msg->sender_id;
  pvVar4 = *(vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             **)msg;
  local_78.second = (unsigned_long)msg->message_id;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar14;
  __it._M_cur = (__node_type *)
                std::
                _Hashtable<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_std::hash<std::pair<unsigned_long,_unsigned_long>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_e8,&local_78);
  if (__it._M_cur == (__node_type *)0x0) {
    local_a8.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.second = 0;
    local_68.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_68.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    vStack_90.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_90.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_90.
    super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.first = (unsigned_long)pvVar4;
    pVar28 = std::
             _Hashtable<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_long,unsigned_long>>,std::hash<std::pair<unsigned_long,unsigned_long>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
             ::_M_emplace<std::pair<std::pair<unsigned_int,unsigned_int>,pstore::broker::pieces>>
                       ((_Hashtable<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,pstore::broker::pieces>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_long,unsigned_long>>,std::hash<std::pair<unsigned_long,unsigned_long>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                         *)local_e8,&local_78);
    __it._M_cur = (__node_type *)
                  pVar28.first.
                  super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                  ._M_cur;
    std::
    vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector(&local_68);
    std::
    vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector(&vStack_90);
    std::
    vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::resize((vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)((long)__it._M_cur + 0x20),(ulong)msg->num_parts);
  }
  pbVar5 = local_f0;
  *(undefined8 *)
   ((long)&((__it._M_cur)->
           super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
           ._M_storage._M_storage + 0x10) = uVar12;
  lVar13 = *(long *)((long)&((__it._M_cur)->
                            super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
                            ._M_storage._M_storage + 0x18);
  if (*(long *)((long)&((__it._M_cur)->
                       super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
                       ._M_storage._M_storage + 0x20) - lVar13 >> 3 != (ulong)msg->num_parts) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"total number of parts mismatch");
    *(undefined ***)this_01 = &PTR__runtime_error_00158f30;
    __cxa_throw(this_01,&number_of_parts_mismatch::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar24 = (ulong)msg->part_no;
  lVar17 = *(long *)(lVar13 + uVar24 * 8);
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  __ptr = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
           (lVar13 + uVar24 * 8);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar13 + uVar24 * 8) =
       pbVar5;
  if (__ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(lVar13 + uVar24 * 8),__ptr);
  }
  if (lVar17 == 0) {
    plVar25 = *(long **)((long)&((__it._M_cur)->
                                super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
                                ._M_storage._M_storage + 0x18);
    plVar3 = *(long **)((long)&((__it._M_cur)->
                               super__Hash_node_value<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>
                               ._M_storage._M_storage + 0x20);
    lVar13 = (long)plVar3 - (long)plVar25 >> 5;
    plVar15 = plVar25;
    if (0 < lVar13) {
      plVar15 = (long *)(((long)plVar3 - (long)plVar25 & 0xffffffffffffffe0U) + (long)plVar25);
      lVar13 = lVar13 + 1;
      plVar18 = plVar25 + 2;
      do {
        if (plVar18[-2] == 0) {
          plVar18 = plVar18 + -2;
          goto LAB_0011d653;
        }
        if (plVar18[-1] == 0) {
          plVar18 = plVar18 + -1;
          goto LAB_0011d653;
        }
        if (*plVar18 == 0) goto LAB_0011d653;
        if (plVar18[1] == 0) {
          plVar18 = plVar18 + 1;
          goto LAB_0011d653;
        }
        lVar13 = lVar13 + -1;
        plVar18 = plVar18 + 4;
      } while (1 < lVar13);
    }
    lVar13 = (long)plVar3 - (long)plVar15 >> 3;
    if (lVar13 == 1) {
LAB_0011d636:
      plVar18 = plVar15;
      if (*plVar15 != 0) {
        plVar18 = plVar3;
      }
    }
    else if (lVar13 == 2) {
LAB_0011d62c:
      plVar18 = plVar15;
      if (*plVar15 != 0) {
        plVar15 = plVar15 + 1;
        goto LAB_0011d636;
      }
    }
    else {
      plVar18 = plVar3;
      if ((lVar13 == 3) && (plVar18 = plVar15, *plVar15 != 0)) {
        plVar15 = plVar15 + 1;
        goto LAB_0011d62c;
      }
    }
LAB_0011d653:
    if (plVar18 == plVar3) {
      local_48 = 0;
      local_40 = 0;
      local_50 = &local_40;
      if (plVar25 != plVar3) {
        do {
          if ((ulong *)*plVar25 == (ulong *)0x0) {
            assert_failed("c.get () != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/parser.cpp"
                          ,0x67);
          }
          std::__cxx11::string::_M_append((char *)&local_50,*(ulong *)*plVar25);
          plVar25 = plVar25 + 1;
        } while (plVar25 != plVar3);
      }
      std::
      _Hashtable<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_pstore::broker::pieces>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_std::hash<std::pair<unsigned_long,_unsigned_long>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(local_e8,(const_iterator)__it._M_cur);
      pbVar27 = local_50;
      pbVar1 = local_50 + local_48;
      if (local_48 != 0) {
        iVar11 = isspace((uint)*local_50);
        pbVar27 = pbVar27 + (iVar11 != 0);
      }
      lVar13 = (long)pbVar1 - (long)pbVar27 >> 2;
      pbVar21 = pbVar27;
      if (0 < lVar13) {
        pbVar21 = pbVar27 + ((long)pbVar1 - (long)pbVar27 & 0xfffffffffffffffc);
        lVar13 = lVar13 + 1;
        pbVar26 = pbVar27 + 3;
        do {
          iVar11 = isspace((uint)pbVar26[-3]);
          if (iVar11 != 0) {
            pbVar26 = pbVar26 + -3;
            goto LAB_0011d7db;
          }
          iVar11 = isspace((uint)pbVar26[-2]);
          if (iVar11 != 0) {
            pbVar26 = pbVar26 + -2;
            goto LAB_0011d7db;
          }
          iVar11 = isspace((uint)pbVar26[-1]);
          if (iVar11 != 0) {
            pbVar26 = pbVar26 + -1;
            goto LAB_0011d7db;
          }
          iVar11 = isspace((uint)*pbVar26);
          if (iVar11 != 0) goto LAB_0011d7db;
          lVar13 = lVar13 + -1;
          pbVar26 = pbVar26 + 4;
        } while (1 < lVar13);
      }
      lVar13 = (long)pbVar1 - (long)pbVar21;
      if (lVar13 == 1) {
LAB_0011d7b9:
        iVar11 = isspace((uint)*pbVar21);
        pbVar26 = pbVar21;
        if (iVar11 == 0) {
          pbVar26 = pbVar1;
        }
      }
      else if (lVar13 == 2) {
LAB_0011d7aa:
        iVar11 = isspace((uint)*pbVar21);
        pbVar26 = pbVar21;
        if (iVar11 == 0) {
          pbVar21 = pbVar21 + 1;
          goto LAB_0011d7b9;
        }
      }
      else {
        pbVar26 = pbVar1;
        if ((lVar13 == 3) && (iVar11 = isspace((uint)*pbVar21), pbVar26 = pbVar21, iVar11 == 0)) {
          pbVar21 = pbVar21 + 1;
          goto LAB_0011d7aa;
        }
      }
LAB_0011d7db:
      pbVar21 = pbVar26;
      if (pbVar26 != pbVar1) {
        iVar11 = isspace((uint)*pbVar26);
        pbVar21 = pbVar26 + (iVar11 != 0);
      }
      local_b8 = &local_a8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_b8,pbVar27,pbVar26);
      local_d8 = (pointer *)&local_c8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_d8,pbVar21,pbVar1);
      _Var20._M_head_impl = (broker_command *)local_e0;
      puVar16 = (ulong *)operator_new(0x40);
      if (local_b8 == &local_a8) {
        local_68.
        super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_a8.
             super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_78.first = (unsigned_long)&local_68;
      }
      else {
        local_78.first = (unsigned_long)local_b8;
      }
      local_68.
      super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_a8.
                             super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_a8.
                             super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_);
      ppuVar2 = &vStack_90.
                 super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_d8 == (pointer *)&local_c8) {
        vStack_90.
        super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = puStack_c0;
        local_a8.
        super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppuVar2;
      }
      else {
        local_a8.
        super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_d8;
      }
      vStack_90.
      super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT71(uStack_c7,local_c8);
      *puVar16 = (ulong)(puVar16 + 2);
      if ((vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)local_78.first == &local_68) {
        puVar16[2] = (ulong)local_68.
                            super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
        puVar16[3] = (ulong)local_68.
                            super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *puVar16 = local_78.first;
        puVar16[2] = (ulong)local_68.
                            super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
      }
      puVar16[1] = local_b0;
      local_68.
      super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_a8.
                            super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_ << 8);
      puVar16[4] = (ulong)(puVar16 + 6);
      if (local_a8.
          super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)ppuVar2) {
        puVar16[6] = (ulong)vStack_90.
                            super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
        puVar16[7] = (ulong)vStack_90.
                            super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        puVar16[4] = (ulong)local_a8.
                            super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
        puVar16[6] = (ulong)vStack_90.
                            super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
      }
      puVar16[5] = local_d0;
      vStack_90.
      super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((ulong)uStack_c7 << 8);
      *(ulong **)_Var20._M_head_impl = puVar16;
      local_78.second = 0;
      uVar10 = local_78.second;
      vStack_90.
      super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      puVar9 = vStack_90.
               super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a8.
      super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
      uVar8 = local_a8.
              super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_;
      local_b0 = 0;
      uVar7 = local_b0;
      local_c8 = 0;
      uVar6 = local_c8;
      local_d0 = 0;
      uVar24 = local_d0;
      local_78.second = 0;
      vStack_90.
      super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
      local_b0 = 0;
      local_c8 = 0;
      local_d0 = 0;
      local_d8 = (pointer *)&local_c8;
      local_b8 = &local_a8;
      local_a8.
      super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppuVar2;
      local_78.first = (unsigned_long)&local_68;
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        uVar24 = local_d0;
        uVar6 = local_c8;
        uVar7 = local_b0;
        uVar8 = local_a8.
                super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start._0_1_;
        puVar9 = vStack_90.
                 super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = local_78.second;
      }
      goto LAB_0011d664;
    }
  }
  *(undefined8 *)
   local_e0._M_t.
   super__Tuple_impl<0UL,_pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
   .super__Head_base<0UL,_pstore::broker::broker_command_*,_false>._M_head_impl = 0;
  _Var20._M_head_impl =
       (broker_command *)
       local_e0._M_t.
       super__Tuple_impl<0UL,_pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
       .super__Head_base<0UL,_pstore::broker::broker_command_*,_false>._M_head_impl;
  uVar24 = local_d0;
  uVar6 = local_c8;
  uVar7 = local_b0;
  uVar8 = local_a8.
          super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_1_;
  puVar9 = vStack_90.
           super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = local_78.second;
LAB_0011d664:
  local_78.second = uVar10;
  vStack_90.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar9;
  local_a8.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = uVar8;
  local_b0 = uVar7;
  local_c8 = uVar6;
  local_d0 = uVar24;
  if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f0,local_f0);
  }
  return (__uniq_ptr_data<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>,_true,_true>
          )(tuple<pstore::broker::broker_command_*,_std::default_delete<pstore::broker::broker_command>_>
            )_Var20._M_head_impl;
}

Assistant:

std::unique_ptr<broker_command> parse (brokerface::message_type const & msg,
                                               partial_cmds & cmds) {

            if (msg.part_no >= msg.num_parts) {
                throw part_number_too_large ();
            }

            auto const now = std::chrono::system_clock::now ();

            auto payload = extract_payload (msg);

            auto const key = std::make_pair (msg.sender_id, msg.message_id);
            auto it = cmds.find (key);
            if (it == std::end (cmds)) {
                it = cmds.insert (std::make_pair (key, pieces{})).first;
                it->second.s_.resize (msg.num_parts);
            }

            // Record the arrival time of this newest message of the set.
            it->second.arrive_time_ = now;
            auto & value = it->second.s_;
            if (value.size () != msg.num_parts) {
                throw number_of_parts_mismatch ();
            }

            bool const was_missing = value[msg.part_no].get () == nullptr;
            value[msg.part_no] = std::move (payload);

            if (was_missing) {
                auto not_null = [] (std::unique_ptr<std::string> const & str) {
                    return str != nullptr;
                };
                if (std::all_of (std::begin (value), std::end (value), not_null)) {
                    std::string complete_command;
                    for (auto const & c : value) {
                        PSTORE_ASSERT (c.get () != nullptr);
                        complete_command += *c;
                    }

                    cmds.erase (it);

                    auto end = std::end (complete_command);
                    auto const verb_parts = extract_word (std::begin (complete_command), end);
                    auto const path_parts = std::make_pair (skip_ws (verb_parts.second, end), end);
                    return std::make_unique<broker_command> (substr (verb_parts),
                                                             substr (path_parts));
                }
            }

            return nullptr;
        }